

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

int __thiscall
QPlainTextDocumentLayout::hitTest
          (QPlainTextDocumentLayout *this,QPointF *param_1,HitTestAccuracy param_2)

{
  return -1;
}

Assistant:

int QPlainTextDocumentLayout::hitTest(const QPointF &, Qt::HitTestAccuracy ) const
{
//     this function is used from
//     QAbstractTextDocumentLayout::anchorAt(), but is not
//     implementable in a plain text document layout, because the
//     layout depends on the top block and top line which depends on
//     the view
    return -1;
}